

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayImpDirWrapper.cpp
# Opt level: O0

QString * __thiscall
DelayImpEntryWrapper::getFieldName
          (QString *__return_storage_ptr__,DelayImpEntryWrapper *this,size_t fieldId)

{
  size_t fieldId_local;
  DelayImpEntryWrapper *this_local;
  
  switch(fieldId) {
  case 0:
    QString::QString(__return_storage_ptr__,"Attributes");
    break;
  case 1:
    QString::QString(__return_storage_ptr__,"Name Addr.");
    break;
  case 2:
    QString::QString(__return_storage_ptr__,"ModuleHandle");
    break;
  case 3:
    QString::QString(__return_storage_ptr__,"IAT");
    break;
  case 4:
    QString::QString(__return_storage_ptr__,"ImportNameTable");
    break;
  case 5:
    QString::QString(__return_storage_ptr__,"BoundIAT");
    break;
  case 6:
    QString::QString(__return_storage_ptr__,"UnloadIAT");
    break;
  case 7:
    QString::QString(__return_storage_ptr__,"Timestamp");
    break;
  default:
    (*(this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
      super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xe])
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QString DelayImpEntryWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case ATTRS : return "Attributes";
        case NAME : return "Name Addr.";
        case MOD : return "ModuleHandle";
        case IAT : return "IAT";
        case INT : return "ImportNameTable";
        case BOUND_IAT : return "BoundIAT";
        case UNLOAD_IAT : return "UnloadIAT";
        case TIMESTAMP : return "Timestamp";
    }
    return getName();
}